

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::RecordPolicies(cmMakefile *this,PolicyMap *pm)

{
  PolicyStatus status;
  undefined4 local_1c;
  PolicyID pid;
  PolicyMap *pm_local;
  cmMakefile *this_local;
  
  for (local_1c = CMP0000; local_1c != CMPCOUNT; local_1c = local_1c + CMP0001) {
    status = GetPolicyStatus(this,local_1c);
    cmPolicies::PolicyMap::Set(pm,local_1c,status);
  }
  return;
}

Assistant:

void cmMakefile::RecordPolicies(cmPolicies::PolicyMap& pm)
{
  /* Record the setting of every policy.  */
  typedef cmPolicies::PolicyID PolicyID;
  for(PolicyID pid = cmPolicies::CMP0000;
      pid != cmPolicies::CMPCOUNT; pid = PolicyID(pid+1))
    {
    pm.Set(pid, this->GetPolicyStatus(pid));
    }
}